

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void __thiscall
rw::ps2::MatPipeline::setTriBufferSizes(MatPipeline *this,uint32 inputStride,uint32 bufferSize)

{
  uint local_28;
  uint i;
  uint32 numTLtris;
  PipeAttribute *a;
  uint32 bufferSize_local;
  uint32 inputStride_local;
  MatPipeline *this_local;
  
  this->inputStride = inputStride;
  this->triListCount = (bufferSize / 3 & 0xfffffffc) * 3;
  this->triStripCount = bufferSize & 0xfffffffc;
  local_28 = 0;
  while( true ) {
    if (9 < local_28) {
      return;
    }
    if ((this->attribs[local_28] != (PipeAttribute *)0x0) &&
       ((this->attribs[local_28]->attrib & 6) != 0)) break;
    local_28 = local_28 + 1;
  }
  this->triStripCount = (bufferSize - 2 & 0xfffffffc) + 2;
  return;
}

Assistant:

void
MatPipeline::setTriBufferSizes(uint32 inputStride, uint32 bufferSize)
{
	PipeAttribute *a;

	this->inputStride = inputStride;
	uint32 numTLtris = bufferSize/3;
	this->triListCount = (numTLtris & ~3) * 3;
	this->triStripCount = bufferSize & ~3;
	for(uint i = 0; i < nelem(this->attribs); i++){
		a = this->attribs[i];
		if(a && a->attrib & AT_RW){
			// broken out attribs have different requirement
			// because we have to be able to restart a strip
			// at an aligned offset
			this->triStripCount = ((bufferSize-2) & ~3)+2;
			return;
		}
	}
}